

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::Fire_PDU::operator==(Fire_PDU *this,Fire_PDU *Value)

{
  KBOOL KVar1;
  Descriptor *this_00;
  Descriptor *Value_00;
  Fire_PDU *Value_local;
  Fire_PDU *this_local;
  
  KVar1 = Warfare_Header::operator!=(&this->super_Warfare_Header,&Value->super_Warfare_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui32FireMissionIndex == Value->m_ui32FireMissionIndex) {
    KVar1 = DATA_TYPE::WorldCoordinates::operator!=(&this->m_Location,&Value->m_Location);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator*(&this->m_pDescriptor);
      Value_00 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator*(&Value->m_pDescriptor);
      KVar1 = DATA_TYPE::Descriptor::operator!=(this_00,Value_00);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Velocity,&Value->m_Velocity);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else if (((float)this->m_f32Range != (float)Value->m_f32Range) ||
                (NAN((float)this->m_f32Range) || NAN((float)Value->m_f32Range))) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Fire_PDU::operator == ( const Fire_PDU & Value ) const
{
    if( Warfare_Header::operator !=( Value ) )                      return false;
    if( m_ui32FireMissionIndex   != Value.m_ui32FireMissionIndex )  return false;
    if( m_Location               != Value.m_Location )              return false;
    if( *m_pDescriptor           != *Value.m_pDescriptor )          return false;
    if( m_Velocity               != Value.m_Velocity )              return false;
    if( m_f32Range               != Value.m_f32Range )              return false;
    return true;
}